

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configreport.h
# Opt level: O0

void tellmeall(void)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  
  pcVar3 = guessprocessor();
  printf("x64 processor:  %s\t",pcVar3);
  printf(" compiler version: %s\t",
         "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
        );
  printf("\n");
  iVar1 = computecacheline();
  if (iVar1 != 0x40) {
    uVar2 = computecacheline();
    printf("cache line: %d bytes\n",(ulong)uVar2);
  }
  return;
}

Assistant:

static inline void tellmeall() {
#if CROARING_IS_BIG_ENDIAN
    printf("big-endian system detected\n"));
#endif
    printf("x64 processor:  %s\t", guessprocessor());
#ifdef __VERSION__
    printf(" compiler version: %s\t", __VERSION__);
#endif

#ifdef __AVX2__
    printf(" Building for AVX2\t");
#endif

    printf("\n");
    if ((sizeof(int) != 4) || (sizeof(long) != 8)) {
        printf("number of bytes: int = %lu long = %lu \n",
               (long unsigned int)sizeof(size_t),
               (long unsigned int)sizeof(int));
    }
#if __LITTLE_ENDIAN__
// This is what we expect!
// printf("you have little endian machine");
#endif
#if __BIG_ENDIAN__
    printf("you have a big endian machine");
#endif
#if __CHAR_BIT__
    if (__CHAR_BIT__ != 8) printf("on your machine, chars don't have 8bits???");
#endif
    if (computecacheline() != 64)
        printf("cache line: %d bytes\n", computecacheline());
}